

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int cram_flush_result(cram_fd *fd)

{
  undefined8 *puVar1;
  cram_fd *fd_00;
  cram_container *c;
  int iVar2;
  t_pool_result *r;
  uint uVar3;
  long lVar4;
  
  r = t_pool_next_result(fd->rqueue);
  if (r == (t_pool_result *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      puVar1 = (undefined8 *)r->data;
      if (puVar1 == (undefined8 *)0x0) {
        t_pool_delete_result(r,0);
        return -1;
      }
      fd_00 = (cram_fd *)*puVar1;
      c = (cram_container *)puVar1[1];
      iVar2 = cram_flush_container2(fd_00,c);
      if (iVar2 != 0) {
        return -1;
      }
      if (0 < c->max_slice) {
        lVar4 = 0;
        do {
          cram_free_slice(c->slices[lVar4]);
          c->slices[lVar4] = (cram_slice *)0x0;
          lVar4 = lVar4 + 1;
        } while (lVar4 < c->max_slice);
      }
      c->slice = (cram_slice *)0x0;
      c->curr_slice = 0;
      cram_free_container(c);
      iVar2 = hflush(fd_00->fp);
      uVar3 = uVar3 | -(uint)(iVar2 != 0);
      t_pool_delete_result(r,1);
      r = t_pool_next_result(fd_00->rqueue);
    } while (r != (t_pool_result *)0x0);
  }
  return uVar3;
}

Assistant:

static int cram_flush_result(cram_fd *fd) {
    int i, ret = 0;
    t_pool_result *r;

    while ((r = t_pool_next_result(fd->rqueue))) {
	cram_job *j = (cram_job *)r->data;
	cram_container *c;

	if (!j) {
	    t_pool_delete_result(r, 0);
	    return -1;
	}

	fd = j->fd;
	c = j->c;

	if (0 != cram_flush_container2(fd, c))
	    return -1;

	/* Free the container */
	for (i = 0; i < c->max_slice; i++) {
	    cram_free_slice(c->slices[i]);
	    c->slices[i] = NULL;
	}

	c->slice = NULL;
	c->curr_slice = 0;

	cram_free_container(c);

	ret |= hflush(fd->fp) == 0 ? 0 : -1;

	t_pool_delete_result(r, 1);
    }

    return ret;
}